

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

CordBuffer __thiscall
absl::lts_20250127::CreateAppendBuffer
          (lts_20250127 *this,InlineData *data,size_t block_size,size_t capacity)

{
  unsigned_long *puVar1;
  char *dst;
  char *src;
  undefined8 extraout_RDX;
  CordBuffer CVar2;
  InlineData local_60 [2];
  undefined1 local_39;
  unsigned_long local_38;
  size_t max_capacity;
  size_t size;
  size_t capacity_local;
  size_t block_size_local;
  InlineData *data_local;
  CordBuffer *buffer;
  
  size = capacity;
  capacity_local = block_size;
  block_size_local = (size_t)data;
  data_local = (InlineData *)this;
  max_capacity = cord_internal::InlineData::inline_size(data);
  local_38 = std::numeric_limits<unsigned_long>::max();
  local_38 = local_38 - max_capacity;
  puVar1 = std::min<unsigned_long>(&local_38,&size);
  size = *puVar1 + max_capacity;
  local_39 = 0;
  if (capacity_local == 0) {
    CordBuffer::CreateWithDefaultLimit((CordBuffer *)this,size);
  }
  else {
    CordBuffer::CreateWithCustomLimit((CordBuffer *)this,capacity_local,size);
  }
  dst = CordBuffer::data((CordBuffer *)this);
  src = cord_internal::InlineData::as_chars((InlineData *)block_size_local);
  cord_internal::SmallMemmove<false>(dst,src,max_capacity);
  CordBuffer::SetLength((CordBuffer *)this,max_capacity);
  cord_internal::InlineData::InlineData(local_60);
  cord_internal::InlineData::operator=((InlineData *)block_size_local,local_60);
  CVar2.rep_.field_0.long_rep.padding = (void *)extraout_RDX;
  CVar2.rep_.field_0.long_rep.rep = (CordRepFlat *)this;
  return (CordBuffer)CVar2.rep_.field_0;
}

Assistant:

static CordBuffer CreateAppendBuffer(InlineData& data, size_t block_size,
                                     size_t capacity) {
  // Watch out for overflow, people can ask for size_t::max().
  const size_t size = data.inline_size();
  const size_t max_capacity = std::numeric_limits<size_t>::max() - size;
  capacity = (std::min)(max_capacity, capacity) + size;
  CordBuffer buffer =
      block_size ? CordBuffer::CreateWithCustomLimit(block_size, capacity)
                 : CordBuffer::CreateWithDefaultLimit(capacity);
  cord_internal::SmallMemmove(buffer.data(), data.as_chars(), size);
  buffer.SetLength(size);
  data = {};
  return buffer;
}